

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O3

Up __thiscall
yactfr::internal::PseudoDtErector::_pseudoDtFromArrayType
          (PseudoDtErector *this,JsonObjVal *jsonDt,string *type,Up *attrs)

{
  int iVar1;
  undefined8 *in_R8;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> *this_00;
  allocator local_81;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_80;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_78 [5];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"minimum-alignment",&local_81);
  MapItemMixin<yactfr::internal::JsonVal>::_tryAt
            ((MapItemMixin<yactfr::internal::JsonVal> *)&type[1]._M_string_length,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)attrs);
  if (iVar1 == 0) {
    local_78[0]._M_head_impl = (MapItem *)*in_R8;
    this_00 = local_78;
    *in_R8 = 0;
    _pseudoDtFromSlArrayType(this,jsonDt,(Up *)type,(uint)this_00);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)attrs);
    if (iVar1 != 0) {
      __assert_fail("type == strs::dlArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/json/pseudo-dt-erector.cpp"
                    ,0x1c2,
                    "PseudoDt::Up yactfr::internal::PseudoDtErector::_pseudoDtFromArrayType(const JsonObjVal &, const std::string &, MapItem::Up)"
                   );
    }
    local_80._M_head_impl = (MapItem *)*in_R8;
    this_00 = &local_80;
    *in_R8 = 0;
    _pseudoDtFromDlArrayType(this,jsonDt,(Up *)type,(uint)this_00);
  }
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             this_00);
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )this;
}

Assistant:

PseudoDt::Up PseudoDtErector::_pseudoDtFromArrayType(const JsonObjVal& jsonDt,
                                                     const std::string& type,
                                                     MapItem::Up attrs)
{
    // minimum alignment
    const auto minAlign = jsonDt.getRawVal(strs::minAlign, 1ULL);

    try {
        if (type == strs::slArray) {
            return this->_pseudoDtFromSlArrayType(jsonDt, std::move(attrs), minAlign);
        } else {
            assert(type == strs::dlArray);
            return this->_pseudoDtFromDlArrayType(jsonDt, std::move(attrs), minAlign);
        }
    } catch (TextParseError& exc) {
        appendMsgToTextParseError(exc, "In array type:", jsonDt.loc());
        throw;
    }
}